

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result wabt::ValidateFuncSignatures(Module *module,Errors *errors,ValidateOptions *options)

{
  FuncModuleField *func_field;
  ModuleField *pMVar1;
  undefined **local_140;
  Validator validator;
  void *local_88;
  void *local_70;
  void *local_58;
  Delegate local_40;
  CheckFuncSignatureExprVisitorDelegate delegate;
  
  anon_unknown_7::Validator::Validator((Validator *)&local_140,errors,(Script *)0x0,options);
  pMVar1 = (module->fields).first_;
  validator.script_ = (Script *)module;
  if (pMVar1 != (ModuleField *)0x0) {
    do {
      if (pMVar1->type_ == Func) {
        anon_unknown_7::Validator::CheckFuncSignature
                  ((Validator *)&local_140,&pMVar1->loc,
                   (FuncDeclaration *)&pMVar1[1].loc.filename.size_);
        local_40._vptr_Delegate = (_func_int **)&PTR__Delegate_01546c48;
        delegate.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)&local_140;
        ExprVisitor::ExprVisitor((ExprVisitor *)&validator.result_,&local_40);
        ExprVisitor::VisitFunc((ExprVisitor *)&validator.result_,(Func *)(pMVar1 + 1));
        if (local_58 != (void *)0x0) {
          operator_delete(local_58);
        }
        if (local_70 != (void *)0x0) {
          operator_delete(local_70);
        }
        if (local_88 != (void *)0x0) {
          operator_delete(local_88);
        }
      }
      pMVar1 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar1 != (ModuleField *)0x0);
  }
  local_140 = &PTR__Validator_01546a28;
  std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::~vector
            ((vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_> *)
             &validator.typechecker_.type_stack_.
              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (validator.typechecker_.error_callback_._M_invoker != (_Invoker_type)0x0) {
    operator_delete(validator.typechecker_.error_callback_._M_invoker);
  }
  if (validator.typechecker_.error_callback_.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)validator.typechecker_.error_callback_.super__Function_base._M_functor._8_8_)
              (&validator.current_except_index_,&validator.current_except_index_,3);
  }
  return (Result)(Enum)validator.expr_loc_;
}

Assistant:

Result ValidateFuncSignatures(const Module* module,
                              Errors* errors,
                              const ValidateOptions& options) {
  Validator validator(errors, nullptr, options);

  return validator.CheckAllFuncSignatures(module);
}